

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::printMinDistMatrix(Graph<Node> *this,ofstream *fout)

{
  vector<int> *this_00;
  int *piVar1;
  ostream *poVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  int Inf;
  ofstream *fout_local;
  Graph<Node> *this_local;
  
  j = 0x3f3f3f3f;
  _i = fout;
  fout_local = (ofstream *)this;
  std::operator<<((ostream *)fout,"Roy-Floyd distances:\n\n");
  for (local_20 = 0; local_20 < this->_nodeCnt; local_20 = local_20 + 1) {
    for (local_24 = 0; poVar2 = (ostream *)_i, local_24 < this->_nodeCnt; local_24 = local_24 + 1) {
      this_00 = vector<vector<int>_>::operator[](&this->minDist,&local_20);
      piVar1 = vector<int>::operator[](this_00,&local_24);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)_i,'\n');
  }
  std::operator<<((ostream *)_i,"------------------------\n\n");
  return;
}

Assistant:

void printMinDistMatrix(std::ofstream &fout) {
        const int Inf = 0x3f3f3f3f;
        fout << "Roy-Floyd distances:\n\n";
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                fout << minDist[i][j] << ' ';
            }

            fout << '\n';
        }

        fout << "------------------------\n\n";
    }